

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O2

Reals __thiscall Omega_h::get_side_vectors(Omega_h *this,Mesh *mesh,LOs *surf_side2side)

{
  int iVar1;
  double dVar2;
  uint uVar3;
  Int i_2;
  Int IVar4;
  Int i;
  long lVar5;
  void *extraout_RDX;
  long lVar6;
  long lVar7;
  Vector<3> *this_00;
  Int i_3;
  ulong uVar8;
  _func_int **pp_Var9;
  Write<int> *this_01;
  double dVar10;
  Alloc *pAVar11;
  double dVar12;
  Reals RVar13;
  Alloc *local_248;
  void *pvStack_240;
  double local_238;
  Reals coords;
  LOs fv2v;
  Matrix<3,_3> x;
  Write<double> normals;
  Matrix<3,_2> b;
  Vector<3> n;
  Write<int> local_150;
  Write<int> local_140;
  Write<signed_char> local_130;
  Write<signed_char> local_120;
  Vector<3> c;
  Write<int> local_f8;
  Write<int> local_e8;
  type lambda_1;
  type lambda;
  
  IVar4 = Mesh::dim(mesh);
  if (IVar4 == 3) {
    Write<int>::Write(&local_e8,&surf_side2side->write_);
    IVar4 = Mesh::dim(mesh);
    if (IVar4 != 3) {
      fail("assertion %s failed at %s +%d\n","mesh->dim() == 3",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_surface.cpp"
           ,0xe);
    }
    if (((ulong)local_e8.shared_alloc_.alloc & 1) == 0) {
      pp_Var9 = (_func_int **)(local_e8.shared_alloc_.alloc)->size;
    }
    else {
      pp_Var9 = (_func_int **)((ulong)local_e8.shared_alloc_.alloc >> 3);
    }
    Mesh::ask_verts_of((Mesh *)&fv2v,(Int)mesh);
    Mesh::coords((Mesh *)&coords);
    std::__cxx11::string::string((string *)&x,"",(allocator *)&local_150);
    uVar3 = (uint)((ulong)pp_Var9 >> 2);
    Write<double>::Write(&normals,uVar3 * 3,(string *)&x);
    std::__cxx11::string::~string((string *)&x);
    Write<int>::Write((Write<int> *)&lambda,&local_e8);
    Write<int>::Write(&lambda.fv2v.write_,&fv2v.write_);
    Write<double>::Write(&lambda.coords.write_,&coords.write_);
    Write<double>::Write(&lambda.normals,&normals);
    Write<int>::Write((Write<int> *)&lambda_1,(Write<int> *)&lambda);
    Write<int>::Write(&lambda_1.ev2v.write_,&lambda.fv2v.write_);
    Write<double>::Write(&lambda_1.coords.write_,&lambda.coords.write_);
    Write<double>::Write(&lambda_1.normals,&lambda.normals);
    if (0 < (int)uVar3) {
      entering_parallel = 1;
      Write<int>::Write(&local_150,(Write<int> *)&lambda_1);
      Write<int>::Write(&local_140,&lambda_1.ev2v.write_);
      Write<double>::Write(&local_130,(Write<signed_char> *)&lambda_1.coords);
      Write<double>::Write(&local_120,(Write<signed_char> *)&lambda_1.normals);
      entering_parallel = 0;
      lVar6 = 0;
      for (uVar8 = 0; uVar8 != (uVar3 & 0x7fffffff); uVar8 = uVar8 + 1) {
        iVar1 = *(int *)((long)(_func_int ***)local_150.shared_alloc_.direct_ptr + uVar8 * 4);
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          *(undefined4 *)
           ((long)x.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_ +
           lVar5 * 4) = *(undefined4 *)
                         ((long)(_func_int ***)local_140.shared_alloc_.direct_ptr +
                         lVar5 * 4 + (long)(iVar1 * 3) * 4);
        }
        local_248 = (Alloc *)x.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                             array_[0];
        pvStack_240 = (void *)CONCAT44(pvStack_240._4_4_,
                                       x.super_Few<Omega_h::Vector<3>,_3>.array_[0].
                                       super_Few<double,_3>.array_[1]._0_4_);
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          iVar1 = *(int *)((long)&local_248 + lVar5 * 4);
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[lVar7] =
                 (double)((_func_int ***)local_130.shared_alloc_.direct_ptr)[iVar1 * 3 + lVar7];
          }
          x.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[2] =
               b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[2];
          x.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[0] =
               b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[0];
          x.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[1] =
               b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[1];
        }
        lVar5 = 0;
        while (lVar5 != 2) {
          n.super_Few<double,_3>.array_[2] =
               x.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5 + 1].super_Few<double,_3>.array_[2];
          n.super_Few<double,_3>.array_[0] =
               x.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5 + 1].super_Few<double,_3>.array_[0];
          n.super_Few<double,_3>.array_[1] =
               x.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5 + 1].super_Few<double,_3>.array_[1];
          local_238 = x.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2];
          local_248 = (Alloc *)x.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                               array_[0];
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            c.super_Few<double,_3>.array_[lVar7] =
                 n.super_Few<double,_3>.array_[lVar7] - (double)(&local_248)[lVar7];
          }
          b.super_Few<Omega_h::Vector<3>,_2>.array_[lVar5].super_Few<double,_3>.array_[2] =
               c.super_Few<double,_3>.array_[2];
          b.super_Few<Omega_h::Vector<3>,_2>.array_[lVar5].super_Few<double,_3>.array_[0] =
               c.super_Few<double,_3>.array_[0];
          b.super_Few<Omega_h::Vector<3>,_2>.array_[lVar5].super_Few<double,_3>.array_[1] =
               c.super_Few<double,_3>.array_[1];
          lVar5 = lVar5 + 1;
        }
        pAVar11 = (Alloc *)(b.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_
                            [2] * b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.
                                  array_[1] -
                           b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_
                           [2] * b.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.
                                 array_[1]);
        dVar12 = b.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[0] *
                 b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[2] -
                 b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[0] *
                 b.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[2];
        dVar10 = b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[0] *
                 b.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[1] -
                 b.super_Few<Omega_h::Vector<3>,_2>.array_[1].super_Few<double,_3>.array_[0] *
                 b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[1];
        pvStack_240 = (void *)dVar12;
        local_238 = dVar10;
        n.super_Few<double,_3>.array_[1] = dVar12;
        n.super_Few<double,_3>.array_[2] = dVar10;
        dVar2 = (double)pAVar11 * (double)pAVar11;
        for (lVar5 = 1; lVar5 != 3; lVar5 = lVar5 + 1) {
          dVar2 = dVar2 + n.super_Few<double,_3>.array_[lVar5] * (double)(&local_248)[lVar5];
        }
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        local_248 = pAVar11;
        pvStack_240 = (void *)dVar12;
        local_238 = dVar10;
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          n.super_Few<double,_3>.array_[lVar5] = (double)(&local_248)[lVar5] / dVar2;
        }
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          *(double *)((long)(_func_int ***)local_120.shared_alloc_.direct_ptr + lVar5 * 8 + lVar6) =
               n.super_Few<double,_3>.array_[lVar5];
        }
        lVar6 = lVar6 + 0x18;
      }
      (anonymous_namespace)::get_triangle_normals(Omega_h::Mesh*,Omega_h::Read<int>)::$_0::~__0
                ((__0 *)&local_150);
    }
    this_01 = &local_e8;
    (anonymous_namespace)::get_triangle_normals(Omega_h::Mesh*,Omega_h::Read<int>)::$_0::~__0
              ((__0 *)&lambda_1);
    Write<double>::Write((Write<signed_char> *)&x,(Write<signed_char> *)&normals);
    Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&x);
    Write<double>::~Write((Write<double> *)&x);
    (anonymous_namespace)::get_triangle_normals(Omega_h::Mesh*,Omega_h::Read<int>)::$_0::~__0
              ((__0 *)&lambda);
    Write<double>::~Write(&normals);
    Write<double>::~Write(&coords.write_);
    this_00 = (Vector<3> *)&fv2v;
  }
  else {
    IVar4 = Mesh::dim(mesh);
    if (IVar4 != 2) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_surface.cpp"
           ,0x54);
    }
    Write<int>::Write(&local_f8,&surf_side2side->write_);
    IVar4 = Mesh::dim(mesh);
    if (IVar4 != 2) {
      fail("assertion %s failed at %s +%d\n","mesh->dim() == 2",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_surface.cpp"
           ,0x20);
    }
    if (((ulong)local_f8.shared_alloc_.alloc & 1) == 0) {
      pp_Var9 = (_func_int **)(local_f8.shared_alloc_.alloc)->size;
    }
    else {
      pp_Var9 = (_func_int **)((ulong)local_f8.shared_alloc_.alloc >> 3);
    }
    Mesh::ask_verts_of((Mesh *)&c,(Int)mesh);
    Mesh::coords((Mesh *)&fv2v);
    std::__cxx11::string::string((string *)&x,"",(allocator *)&local_150);
    uVar3 = (uint)((ulong)pp_Var9 >> 2);
    Write<double>::Write(&coords.write_,uVar3 * 2,(string *)&x);
    std::__cxx11::string::~string((string *)&x);
    Write<int>::Write((Write<int> *)&lambda_1,&local_f8);
    Write<int>::Write(&lambda_1.ev2v.write_,(Write<int> *)&c);
    Write<double>::Write(&lambda_1.coords.write_,(Write<double> *)&fv2v);
    Write<double>::Write(&lambda_1.normals,&coords.write_);
    Write<int>::Write(&local_150,(Write<int> *)&lambda_1);
    Write<int>::Write(&local_140,&lambda_1.ev2v.write_);
    Write<double>::Write((Write<double> *)&local_130,&lambda_1.coords.write_);
    Write<double>::Write((Write<double> *)&local_120,&lambda_1.normals);
    if (0 < (int)uVar3) {
      entering_parallel = 1;
      Write<int>::Write((Write<int> *)&x,&local_150);
      Write<int>::Write((Write<int> *)
                        (x.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_ +
                        2),&local_140);
      Write<double>::Write
                ((Write<signed_char> *)
                 (x.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_ + 1),
                 &local_130);
      Write<double>::Write
                ((Write<signed_char> *)(x.super_Few<Omega_h::Vector<3>,_3>.array_ + 2),&local_120);
      entering_parallel = 0;
      for (uVar8 = 0; uVar8 != (uVar3 & 0x7fffffff); uVar8 = uVar8 + 1) {
        iVar1 = *(int *)(CONCAT44(x.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                                  array_[1]._4_4_,
                                  x.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                                  array_[1]._0_4_) + uVar8 * 4);
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          *(undefined4 *)
           ((long)b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_ +
           lVar6 * 4 + -0x10) =
               *(undefined4 *)
                ((long)x.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] +
                 (long)(iVar1 * 2) * 4 + lVar6 * 4);
        }
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          iVar1 = *(int *)((long)b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.
                                 array_ + lVar6 * 4 + -0x10);
          for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
            b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[lVar5] =
                 *(double *)
                  ((long)x.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2]
                   + (long)(iVar1 * 2) * 8 + lVar5 * 8);
          }
          (&lambda.surf_tri2tri)[lVar6].write_.shared_alloc_.alloc =
               (Alloc *)b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[0];
          (&lambda.surf_tri2tri)[lVar6].write_.shared_alloc_.direct_ptr =
               (void *)b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[1];
        }
        local_248 = lambda.fv2v.write_.shared_alloc_.alloc;
        pvStack_240 = lambda.fv2v.write_.shared_alloc_.direct_ptr;
        n.super_Few<double,_3>.array_[0] = (double)lambda.surf_tri2tri.write_.shared_alloc_.alloc;
        n.super_Few<double,_3>.array_[1] =
             (double)lambda.surf_tri2tri.write_.shared_alloc_.direct_ptr;
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[lVar6] =
               (double)(&local_248)[lVar6] - n.super_Few<double,_3>.array_[lVar6];
        }
        dVar10 = b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[1] *
                 b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[1];
        local_248 = (Alloc *)((ulong)b.super_Few<Omega_h::Vector<3>,_2>.array_[0].
                                     super_Few<double,_3>.array_[1] ^ 0x8000000000000000);
        pvStack_240 = (void *)b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.
                              array_[0];
        dVar2 = b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[0] *
                b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[0];
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[lVar6] =
               (double)(&local_248)[lVar6] / SQRT(dVar2 + dVar10);
        }
        local_248 = (Alloc *)b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.
                             array_[0];
        pvStack_240 = (void *)b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.
                              array_[1];
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_[lVar6] =
               -(double)(&local_248)[lVar6];
        }
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          *(double *)
           ((long)x.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1] +
           lVar6 * 8) = b.super_Few<Omega_h::Vector<3>,_2>.array_[0].super_Few<double,_3>.array_
                        [lVar6];
        }
        x.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1] =
             (double)((long)x.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_
                            [1] + 0x10);
      }
      (anonymous_namespace)::get_edge_normals(Omega_h::Mesh*,Omega_h::Read<int>)::$_0::~__0
                ((__0 *)&x);
    }
    this_01 = &local_f8;
    (anonymous_namespace)::get_edge_normals(Omega_h::Mesh*,Omega_h::Read<int>)::$_0::~__0
              ((__0 *)&local_150);
    Write<double>::Write((Write<signed_char> *)&x,(Write<signed_char> *)&coords);
    Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&x);
    Write<double>::~Write((Write<double> *)&x);
    (anonymous_namespace)::get_edge_normals(Omega_h::Mesh*,Omega_h::Read<int>)::$_0::~__0
              ((__0 *)&lambda_1);
    Write<double>::~Write(&coords.write_);
    Write<double>::~Write((Write<double> *)&fv2v);
    this_00 = &c;
  }
  Write<int>::~Write((Write<int> *)this_00);
  Write<int>::~Write(this_01);
  RVar13.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar13.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar13.write_.shared_alloc_;
}

Assistant:

Reals get_side_vectors(Mesh* mesh, LOs surf_side2side) {
  if (mesh->dim() == 3) return get_triangle_normals(mesh, surf_side2side);
  if (mesh->dim() == 2) return get_edge_normals(mesh, surf_side2side);
  OMEGA_H_NORETURN(Reals());
}